

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<InternalHashToName>::Append
          (ON_SimpleArray<InternalHashToName> *this,InternalHashToName *x)

{
  ON__UINT8 *pOVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  wchar_t *pwVar4;
  int iVar5;
  InternalHashToName *pIVar6;
  InternalHashToName *pIVar7;
  
  iVar5 = this->m_count;
  pIVar6 = x;
  if (iVar5 == this->m_capacity) {
    iVar5 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pIVar6 = (InternalHashToName *)onmalloc(0x20);
      uVar2 = *(undefined8 *)((x->m_dirty_name_hash).m_digest + 8);
      uVar3 = *(undefined8 *)((x->m_dirty_name_hash).m_digest + 0x10);
      pwVar4 = x->m_family_name;
      *(undefined8 *)(pIVar6->m_dirty_name_hash).m_digest =
           *(undefined8 *)(x->m_dirty_name_hash).m_digest;
      *(undefined8 *)((pIVar6->m_dirty_name_hash).m_digest + 8) = uVar2;
      *(undefined8 *)((pIVar6->m_dirty_name_hash).m_digest + 0x10) = uVar3;
      pIVar6->m_family_name = pwVar4;
    }
    Reserve(this,(long)iVar5);
    pIVar7 = this->m_a;
    if (pIVar7 == (InternalHashToName *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar5 = this->m_count;
  }
  else {
    pIVar7 = this->m_a;
  }
  this->m_count = iVar5 + 1;
  uVar2 = *(undefined8 *)(pIVar6->m_dirty_name_hash).m_digest;
  uVar3 = *(undefined8 *)((pIVar6->m_dirty_name_hash).m_digest + 8);
  pwVar4 = pIVar6->m_family_name;
  pOVar1 = pIVar7[iVar5].m_dirty_name_hash.m_digest + 0x10;
  *(undefined8 *)pOVar1 = *(undefined8 *)((pIVar6->m_dirty_name_hash).m_digest + 0x10);
  *(wchar_t **)(pOVar1 + 8) = pwVar4;
  *(undefined8 *)pIVar7[iVar5].m_dirty_name_hash.m_digest = uVar2;
  *(undefined8 *)(pIVar7[iVar5].m_dirty_name_hash.m_digest + 8) = uVar3;
  if (pIVar6 != x) {
    onfree(pIVar6);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}